

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O2

double __thiscall
ON_SubDEdge::GetSharpSubdivisionPoint(ON_SubDEdge *this,ON_3dPoint *sharp_subdivision_point)

{
  double dVar1;
  bool bVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  ON_3dPoint local_30;
  
  bVar2 = IsSharp(this);
  if (bVar2) {
    local_30.x = (double)Sharpness(this,false);
    dVar1 = ON_SubDEdgeSharpness::Average((ON_SubDEdgeSharpness *)&local_30);
    ControlNetCenterPoint(&local_30,this);
    sharp_subdivision_point->z = local_30.z;
    sharp_subdivision_point->x = local_30.x;
    sharp_subdivision_point->y = local_30.y;
    uVar3 = SUB84(dVar1,0);
    uVar4 = (undefined4)((ulong)dVar1 >> 0x20);
  }
  else {
    sharp_subdivision_point->z = ON_3dPoint::NanPoint.z;
    dVar1 = ON_3dPoint::NanPoint.y;
    sharp_subdivision_point->x = ON_3dPoint::NanPoint.x;
    sharp_subdivision_point->y = dVar1;
    uVar3 = 0;
    uVar4 = 0;
  }
  return (double)CONCAT44(uVar4,uVar3);
}

Assistant:

double ON_SubDEdge::GetSharpSubdivisionPoint(ON_3dPoint& sharp_subdivision_point) const
{
  if (IsSharp())
  {
    const double s = Sharpness(false).Average();
    sharp_subdivision_point = this->ControlNetCenterPoint();
    return s;
  }

  sharp_subdivision_point = ON_3dPoint::NanPoint;
  return 0.0;
}